

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffpss(fitsfile *fptr,int datatype,long *blc,long *trc,void *array,int *status)

{
  int in_ESI;
  int *in_R9;
  long naxes [9];
  int naxis;
  long *in_stack_00000120;
  long *in_stack_00000128;
  long *in_stack_00000130;
  long *in_stack_00000138;
  long *in_stack_00000140;
  fitsfile *in_stack_00000148;
  long in_stack_00000150;
  fitsfile *in_stack_00000158;
  ULONGLONG *in_stack_00000160;
  int *in_stack_00000168;
  double *in_stack_00000170;
  int *in_stack_00000178;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  undefined4 local_4;
  
  if (*in_R9 < 1) {
    ffgidm(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ffgisz(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,(long *)in_stack_ffffffffffffff78,
           in_stack_ffffffffffffff70);
    if (in_ESI == 0xb) {
      ffpssb(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,(uchar *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0xc) {
      ffpsssb(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
              in_stack_00000138,in_stack_00000130,(char *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0x14) {
      ffpssui(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
              in_stack_00000138,in_stack_00000130,(unsigned_short *)in_stack_00000170,
              in_stack_00000178);
    }
    else if (in_ESI == 0x15) {
      ffpssi(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,(short *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0x1e) {
      ffpssuk(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
              in_stack_00000138,in_stack_00000130,(uint *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0x1f) {
      ffpssk(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,(int *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0x28) {
      ffpssuj(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
              in_stack_00000138,in_stack_00000130,(unsigned_long *)in_stack_00000170,
              in_stack_00000178);
    }
    else if (in_ESI == 0x29) {
      ffpssj(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,(long *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0x50) {
      ffpssujj(in_stack_00000148,(long)in_stack_00000140,(long)in_stack_00000138,in_stack_00000130,
               in_stack_00000128,in_stack_00000120,in_stack_00000160,in_stack_00000168);
    }
    else if (in_ESI == 0x51) {
      ffpssjj(in_stack_00000148,(long)in_stack_00000140,(long)in_stack_00000138,in_stack_00000130,
              in_stack_00000128,in_stack_00000120,(LONGLONG *)in_stack_00000160,in_stack_00000168);
    }
    else if (in_ESI == 0x2a) {
      ffpsse(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,(float *)in_stack_00000170,in_stack_00000178);
    }
    else if (in_ESI == 0x52) {
      ffpssd(in_stack_00000158,in_stack_00000150,(long)in_stack_00000148,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,in_stack_00000170,in_stack_00000178);
    }
    else {
      *in_R9 = 0x19a;
    }
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffpss(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *blc,        /* I - 'bottom left corner' of the subsection  */
            long *trc ,       /* I - 'top right corner' of the subsection    */
            void *array,      /* I - array of values that are written        */
            int  *status)     /* IO - error status                           */
/*
  Write a section of values to the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

  This routine supports writing to large images with
  more than 2**31 pixels.
*/
{
    int naxis;
    long naxes[9];

    if (*status > 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, 9, naxes, status);

    if (datatype == TBYTE)
    {
        ffpssb(fptr, 1, naxis, naxes, blc, trc,
               (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
        ffpsssb(fptr, 1, naxis, naxes, blc, trc,
               (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
        ffpssui(fptr, 1, naxis, naxes, blc, trc,
               (unsigned short *) array, status);
    }
    else if (datatype == TSHORT)
    {
        ffpssi(fptr, 1, naxis, naxes, blc, trc,
               (short *) array, status);
    }
    else if (datatype == TUINT)
    {
        ffpssuk(fptr, 1, naxis, naxes, blc, trc,
               (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
        ffpssk(fptr, 1, naxis, naxes, blc, trc,
               (int *) array, status);
    }
    else if (datatype == TULONG)
    {
        ffpssuj(fptr, 1, naxis, naxes, blc, trc,
               (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
        ffpssj(fptr, 1, naxis, naxes, blc, trc,
               (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffpssujj(fptr, 1, naxis, naxes, blc, trc,
               (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffpssjj(fptr, 1, naxis, naxes, blc, trc,
               (LONGLONG *) array, status);
    }    
    else if (datatype == TFLOAT)
    {
        ffpsse(fptr, 1, naxis, naxes, blc, trc,
               (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffpssd(fptr, 1, naxis, naxes, blc, trc,
               (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}